

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool dirichlet_mix_check(int comp_num,int elem_num,double *a,double *comp_weight)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  uVar7 = 0;
  uVar2 = 0;
  if (0 < elem_num) {
    uVar2 = (ulong)(uint)elem_num;
  }
  uVar6 = (ulong)(uint)comp_num;
  if (comp_num < 1) {
    uVar6 = uVar7;
  }
  for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      if (a[uVar8] <= 0.0) {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n");
        std::operator<<((ostream *)&std::cerr,"  A(ELEM,COMP) <= 0.\n");
        poVar3 = std::operator<<((ostream *)&std::cerr,"  COMP = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar7);
        std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<((ostream *)&std::cerr,"  ELEM = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar8);
        std::operator<<(poVar3,"\n");
        std::operator<<((ostream *)&std::cerr,"  A(COMP,ELEM) = ");
        dVar9 = a[uVar8];
        goto LAB_00199e25;
      }
    }
    a = a + elem_num;
  }
  uVar2 = 0;
  bVar4 = false;
LAB_00199e4c:
  if (uVar6 == uVar2) {
    bVar1 = true;
    if (!bVar4) {
      std::operator<<((ostream *)&std::cerr," \n");
      std::operator<<((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n");
      pcVar5 = "  All component weights are zero.\n";
      poVar3 = (ostream *)&std::cerr;
LAB_00199e33:
      std::operator<<(poVar3,pcVar5);
      bVar1 = false;
    }
    return bVar1;
  }
  if (0.0 <= comp_weight[uVar2]) goto code_r0x00199e5d;
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DIRICHLET_MIX_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,"  COMP_WEIGHT(COMP) < 0.\n");
  poVar3 = std::operator<<((ostream *)&std::cerr,"  COMP = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar2);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&std::cerr,"  COMP_WEIGHT(COMP) = ");
  dVar9 = comp_weight[uVar2];
LAB_00199e25:
  poVar3 = std::ostream::_M_insert<double>(dVar9);
  pcVar5 = "\n";
  goto LAB_00199e33;
code_r0x00199e5d:
  bVar4 = (bool)(bVar4 | 0.0 < comp_weight[uVar2]);
  uVar2 = uVar2 + 1;
  goto LAB_00199e4c;
}

Assistant:

bool dirichlet_mix_check ( int comp_num, int elem_num, double a[],
  double comp_weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_MIX_CHECK checks the parameters of a Dirichlet mixture PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int COMP_NUM, the number of components in the Dirichlet
//    mixture density, that is, the number of distinct Dirichlet PDF's
//    that are mixed together.
//
//    Input, int ELEM_NUM, the number of elements of an observation.
//
//    Input, double A[ELEM_NUM*COMP_NUM], the probabilities
//    for element ELEM_NUM in component COMP_NUM.
//    Each A[I,J] should be positive.
//
//    Input, double COMP_WEIGHT[COMP_NUM], the mixture weights of the densities.
//    These do not need to be normalized.  The weight of a given component is
//    the relative probability that that component will be used to generate
//    the sample.
//
//    Output, bool DIRICHLET_MIX_CHECK, is true if the parameters are legal.
//
{
  int comp_i;
  int elem_i;
  bool positive;

  for ( comp_i = 0; comp_i < comp_num; comp_i++ )
  {
    for ( elem_i = 0; elem_i < elem_num; elem_i++ )
    {
      if ( a[elem_i+comp_i*elem_num] <= 0.0 )
      {
        cerr << " \n";
        cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
        cerr << "  A(ELEM,COMP) <= 0.\n";
        cerr << "  COMP = " << comp_i << "\n";
        cerr << "  ELEM = " << elem_i << "\n";
        cerr << "  A(COMP,ELEM) = " << a[elem_i+comp_i*elem_num] << "\n";
        return false;
      }
    }
  }

  positive = false;

  for ( comp_i = 0; comp_i < comp_num; comp_i++ )
  {
    if ( comp_weight[comp_i] < 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
      cerr << "  COMP_WEIGHT(COMP) < 0.\n";
      cerr << "  COMP = " << comp_i << "\n";
      cerr << "  COMP_WEIGHT(COMP) = " << comp_weight[comp_i] << "\n";
      return false;
    }
    else if ( 0.0 < comp_weight[comp_i] )
    {
      positive = true;
    }
  }

  if ( !positive )
  {
    cerr << " \n";
    cerr << "DIRICHLET_MIX_CHECK - Warning!\n";
    cerr << "  All component weights are zero.\n";
    return false;
  }

  return true;
}